

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

void envy_bios_print_power_unk44(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (bios->power).unk44.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar2 = (ulong)(bios->power).unk44.version;
  if ((bios->power).unk44.valid != '\0') {
    fprintf((FILE *)out,"PERF TEST SPEC table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
    envy_bios_dump_hex(bios,out,(bios->power).unk44.offset,(uint)(bios->power).unk44.hlen,mask);
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse PERF TEST SPEC table at 0x%x, version %x\n",(ulong)uVar1,
          uVar2);
  return;
}

Assistant:

void envy_bios_print_power_unk44(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk44 *unk44 = &bios->power.unk44;

	if (!unk44->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk44->valid) {
		fprintf(out, "Failed to parse PERF TEST SPEC table at 0x%x, version %x\n", unk44->offset, unk44->version);
		return;
	}

	fprintf(out, "PERF TEST SPEC table at 0x%x, version %x\n", unk44->offset, unk44->version);
	envy_bios_dump_hex(bios, out, unk44->offset, unk44->hlen, mask);
	fprintf(out, "\n");
}